

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  int iVar1;
  Descriptor *pDVar2;
  long lVar3;
  void **ppvVar4;
  DynamicMessage *pDVar5;
  int *piVar6;
  long lVar7;
  RepeatedPtrFieldBase *this_00;
  long i;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_00290b40;
  pDVar2 = this->type_info_->type;
  UnknownFieldSet::~UnknownFieldSet
            ((UnknownFieldSet *)
             ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
             (long)this->type_info_->unknown_fields_offset));
  lVar7 = (long)this->type_info_->extensions_offset;
  if (lVar7 != -1) {
    internal::ExtensionSet::~ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar7));
  }
  if (0 < *(int *)(pDVar2 + 0x2c)) {
    lVar7 = 0x2c;
    i = 0;
    do {
      lVar3 = *(long *)(pDVar2 + 0x30);
      piVar6 = internal::scoped_array<int>::operator[](&this->type_info_->offsets,i);
      this_00 = (RepeatedPtrFieldBase *)
                ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + (long)*piVar6);
      iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar3 + lVar7) * 4);
      if (*(int *)(lVar3 + 4 + lVar7) == 3) {
        switch(iVar1) {
        case 1:
        case 2:
        case 3:
        case 4:
        case 5:
        case 6:
        case 7:
        case 8:
          if (this_00->elements_ != (void **)0x0) {
            operator_delete__(this_00->elements_);
          }
          break;
        case 9:
          internal::RepeatedPtrFieldBase::
          Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(this_00);
          break;
        case 10:
          internal::RepeatedPtrFieldBase::
          Destroy<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                    (this_00);
        }
      }
      else if (iVar1 == 10) {
        pDVar5 = this->type_info_->prototype;
        if ((pDVar5 != (DynamicMessage *)0x0 && pDVar5 != this) &&
           (this_00->elements_ != (void **)0x0)) {
          (**(code **)((long)*this_00->elements_ + 8))();
        }
      }
      else if ((iVar1 == 9) &&
              (ppvVar4 = this_00->elements_, ppvVar4 != *(void ***)(lVar3 + 0x44 + lVar7))) {
        if (ppvVar4 != (void **)0x0) {
          if ((void **)*ppvVar4 != ppvVar4 + 2) {
            operator_delete(*ppvVar4,(long)ppvVar4[2] + 1);
          }
        }
        operator_delete(ppvVar4,0x20);
      }
      i = i + 1;
      lVar7 = lVar7 + 0x78;
    } while (i < *(int *)(pDVar2 + 0x2c));
  }
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->type;

  reinterpret_cast<UnknownFieldSet*>(
    OffsetToPointer(type_info_->unknown_fields_offset))->~UnknownFieldSet();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(
      OffsetToPointer(type_info_->extensions_offset))->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the the DynamicMessage constructor.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
        case FieldDescriptor::CPPTYPE_##UPPERCASE :                           \
          reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr)              \
              ->~RepeatedField<LOWERCASE>();                                  \
          break

        HANDLE_TYPE( INT32,  int32);
        HANDLE_TYPE( INT64,  int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE( FLOAT,  float);
        HANDLE_TYPE(  BOOL,   bool);
        HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              reinterpret_cast<RepeatedPtrField<string>*>(field_ptr)
                  ->~RepeatedPtrField<string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
              ->~RepeatedPtrField<Message>();
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->options().ctype()) {
        default:  // TODO(kenton):  Support other string reps.
        case FieldOptions::STRING: {
          string* ptr = *reinterpret_cast<string**>(field_ptr);
          if (ptr != &field->default_value_string()) {
            delete ptr;
          }
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != NULL) {
          delete message;
        }
      }
    }
  }
}